

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fft.c
# Opt level: O2

int WebRtcSpl_RealForwardFFT(RealFFT *self,int16_t *real_data_in,int16_t *complex_data_out)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int16_t complex_buffer [2048];
  
  iVar2 = self->order;
  bVar1 = (byte)iVar2 & 0x1f;
  uVar5 = 1 << bVar1;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < 1 << bVar1) {
    uVar4 = (ulong)uVar5;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    complex_buffer[uVar3 * 2] = real_data_in[uVar3];
    complex_buffer[uVar3 * 2 + 1] = 0;
  }
  WebRtcSpl_ComplexBitReverse(complex_buffer,iVar2);
  iVar2 = WebRtcSpl_ComplexFFT(complex_buffer,self->order,1);
  memcpy(complex_data_out,complex_buffer,(long)(int)uVar5 * 2 + 4);
  return iVar2;
}

Assistant:

int WebRtcSpl_RealForwardFFT(struct RealFFT* self,
                             const int16_t* real_data_in,
                             int16_t* complex_data_out) {
  int i = 0;
  int j = 0;
  int result = 0;
  int n = 1 << self->order;
  // The complex-value FFT implementation needs a buffer to hold 2^order
  // 16-bit COMPLEX numbers, for both time and frequency data.
  int16_t complex_buffer[2 << kMaxFFTOrder];

  // Insert zeros to the imaginary parts for complex forward FFT input.
  for (i = 0, j = 0; i < n; i += 1, j += 2) {
    complex_buffer[j] = real_data_in[i];
    complex_buffer[j + 1] = 0;
  };

  WebRtcSpl_ComplexBitReverse(complex_buffer, self->order);
  result = WebRtcSpl_ComplexFFT(complex_buffer, self->order, 1);

  // For real FFT output, use only the first N + 2 elements from
  // complex forward FFT.
  memcpy(complex_data_out, complex_buffer, sizeof(int16_t) * (n + 2));

  return result;
}